

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

void __thiscall YacclabTests::BlockSizeTest(YacclabTests *this)

{
  pointer pbVar1;
  GlobalConfig *pGVar2;
  pointer pMVar3;
  pointer pdVar4;
  bool bVar5;
  char cVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  Labeling *pLVar7;
  undefined4 extraout_var;
  ModeConfig *pMVar8;
  ostream *poVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int k;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  string *s;
  uint uVar18;
  YacclabTests *this_00;
  int k_2;
  long lVar19;
  long lVar20;
  int d;
  int iVar21;
  ulong uVar22;
  int k_1;
  ulong uVar23;
  pointer pbVar24;
  int k_3;
  uint progress;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  double dVar25;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> dims;
  string algo_name_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  header;
  string filename;
  path is_path;
  path dataset_path;
  path filename_path;
  path current_latex_path;
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  results;
  vector<double,_std::allocator<double>_> min_times;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  path current_output_path;
  allocator_type local_348 [96];
  OutputBox ob;
  vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> tmp;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,
                 &this->mode_cfg_->mode," Block Size Test");
  OutputBox::OutputBox
            (&ob,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp,0x50,2);
  std::__cxx11::string::~string((string *)&tmp);
  filesystem::operator/
            ((path *)&tmp,&this->glob_cfg_->glob_output_path,&this->mode_cfg_->mode_output_path);
  std::__cxx11::string::string((string *)&is_path,"Blocksize",(allocator *)&current_latex_path);
  filesystem::path::path(&dataset_path,&is_path.path_);
  filesystem::operator/(&current_output_path,(path *)&tmp,&dataset_path);
  std::__cxx11::string::~string((string *)&dataset_path);
  std::__cxx11::string::~string((string *)&is_path);
  std::__cxx11::string::~string((string *)&tmp);
  dims.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dims.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dims.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar8 = this->mode_cfg_;
  for (iVar13 = (pMVar8->blocksize_x)._M_elems[0]; iVar13 <= (pMVar8->blocksize_x)._M_elems[1];
      iVar13 = iVar13 + (pMVar8->blocksize_x)._M_elems[2]) {
    for (iVar17 = (pMVar8->blocksize_y)._M_elems[0]; iVar17 <= (pMVar8->blocksize_y)._M_elems[1];
        iVar17 = iVar17 + (pMVar8->blocksize_y)._M_elems[2]) {
      for (iVar21 = (pMVar8->blocksize_z)._M_elems[0]; iVar21 <= (pMVar8->blocksize_z)._M_elems[1];
          iVar21 = iVar21 + (pMVar8->blocksize_z)._M_elems[2]) {
        if (iVar17 * iVar13 * iVar21 < 1) {
          tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar17,iVar13);
          tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(tmp.
                                 super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar21);
          std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>::
          emplace_back<std::array<int,3ul>>
                    ((vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>> *)&dims,
                     (array<int,_3UL> *)&tmp);
          pMVar8 = this->mode_cfg_;
        }
      }
    }
  }
  results.
  super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  header.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  header.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (pMVar8->ccl_blocksize_algorithms).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar24 = (pMVar8->ccl_blocksize_algorithms).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar1; pbVar24 = pbVar24 + 1
      ) {
    __x = KernelMapSingleton::GetKernels(pbVar24);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&header,__x);
  }
  for (uVar12 = 0; pMVar8 = this->mode_cfg_,
      uVar12 < (ulong)((long)(pMVar8->ccl_blocksize_algorithms).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pMVar8->ccl_blocksize_algorithms).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar12 = uVar12 + 1) {
    tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar15 = 0;
        uVar15 < (ulong)((long)header.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)header.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar15 = uVar15 + 1)
    {
      is_path.path_._M_dataplus._M_p._0_4_ =
           (undefined4)
           (((long)dims.
                   super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)dims.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0xc);
      current_latex_path.path_._M_dataplus._M_p._0_4_ =
           (undefined4)
           ((ulong)((long)(this->mode_cfg_->average_datasets).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mode_cfg_->average_datasets).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5);
      dataset_path.path_._M_dataplus._M_p = (pointer)0x0;
      std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>::emplace_back<int,int,double>
                ((vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>> *)&tmp,(int *)&is_path,
                 (int *)&current_latex_path,(double *)&dataset_path);
    }
    std::
    vector<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>,std::allocator<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>>
    ::emplace_back<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>
              ((vector<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>,std::allocator<std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>>>
                *)&results,&tmp);
    std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::~vector(&tmp);
  }
  uVar14 = 0;
  while( true ) {
    pbVar24 = (pMVar8->blocksize_datasets).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pMVar8->blocksize_datasets).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5) <=
        (ulong)uVar14) break;
    std::__cxx11::string::string((string *)&tmp,(string *)(pbVar24 + uVar14));
    pGVar2 = this->glob_cfg_;
    filesystem::path::path(&is_path,(string *)&tmp);
    filesystem::operator/(&dataset_path,&pGVar2->input_path,&is_path);
    std::__cxx11::string::~string((string *)&is_path);
    filesystem::path::path(&current_latex_path,&this->glob_cfg_->input_txt);
    filesystem::operator/(&is_path,&dataset_path,&current_latex_path);
    std::__cxx11::string::~string((string *)&current_latex_path);
    filesystem::operator/
              ((path *)&filename,&this->glob_cfg_->glob_output_path,
               &this->mode_cfg_->mode_output_path);
    filesystem::operator/(&current_latex_path,(path *)&filename,&this->glob_cfg_->latex_path);
    std::__cxx11::string::~string((string *)&filename);
    this_00 = (YacclabTests *)&current_output_path;
    bVar5 = filesystem::create_directories((path *)this_00);
    if (bVar5) {
      filenames.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filenames.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      filenames.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar5 = LoadFileList(this_00,&filenames,&is_path);
      if (bVar5) {
        OutputBox::StartUnitaryBox
                  (&ob,(string *)&tmp,
                   ((long)filenames.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)filenames.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x28 & 0xffffffff);
        progress = 0;
        while( true ) {
          if ((ulong)(((long)filenames.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)filenames.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= (ulong)progress)
          break;
          ProgressBar::Display(&ob.pb,progress);
          std::__cxx11::string::string
                    ((string *)&filename,
                     (string *)
                     (filenames.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + progress));
          filesystem::path::path((path *)&algo_name_1,&filename);
          filesystem::operator/(&filename_path,&dataset_path,(path *)&algo_name_1);
          std::__cxx11::string::~string((string *)&algo_name_1);
          pLVar7 = LabelingMapSingleton::GetLabeling
                             ((this->mode_cfg_->ccl_blocksize_algorithms).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          iVar13 = (*pLVar7->_vptr_Labeling[9])(pLVar7);
          std::__cxx11::string::string((string *)&algo_name_1,(string *)&filename_path);
          cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar13) + 0x20))
                            ((long *)CONCAT44(extraout_var,iVar13),&algo_name_1);
          std::__cxx11::string::~string((string *)&algo_name_1);
          if (cVar6 == '\0') {
            std::operator+(&local_388,"Unable to open \'",&filename);
            std::operator+(&algo_name_1,&local_388,"\', skipped");
            OutputBox::Cmessage(&ob,&algo_name_1);
            std::__cxx11::string::~string((string *)&algo_name_1);
            std::__cxx11::string::~string((string *)&local_388);
          }
          else {
            uVar11 = 0;
            while( true ) {
              uVar12 = (ulong)uVar11;
              pbVar24 = (this->mode_cfg_->ccl_blocksize_algorithms).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->mode_cfg_->ccl_blocksize_algorithms).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5) <=
                  uVar12) break;
              std::__cxx11::string::string((string *)&algo_name_1,(string *)(pbVar24 + uVar12));
              pLVar7 = LabelingMapSingleton::GetLabeling(&algo_name_1);
              uVar18 = 0;
              while( true ) {
                uVar15 = (ulong)uVar18;
                if ((ulong)(((long)dims.
                                   super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)dims.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar15)
                break;
                local_388._M_dataplus._M_p = (pointer)0x7fefffffffffffff;
                std::vector<double,_std::allocator<double>_>::vector
                          (&min_times,
                           (long)header.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)header.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5,
                           (value_type_conflict5 *)&local_388,local_348);
                for (uVar10 = 0; uVar10 < this->mode_cfg_->blocksize_tests_number;
                    uVar10 = uVar10 + 1) {
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PerformanceEvaluator::Elapsed>_>_>
                  ::clear(&(pLVar7->perf_).counters_._M_t);
                  (*pLVar7->_vptr_Labeling[0xb])
                            (pLVar7,(ulong)(uint)dims.
                                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                                 _M_elems[0],
                             (ulong)(uint)dims.
                                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_elems
                                          [1],
                             (ulong)(uint)dims.
                                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_elems
                                          [2]);
                  lVar16 = 0;
                  for (uVar23 = 0;
                      pbVar24 = header.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                      uVar23 < (ulong)((long)header.
                                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar24 >> 5); uVar23 = uVar23 + 1) {
                    s = (string *)((long)&(pbVar24->_M_dataplus)._M_p + lVar16);
                    bVar5 = PerformanceEvaluator::find(&pLVar7->perf_,s);
                    pdVar4 = min_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if (bVar5) {
                      dVar25 = PerformanceEvaluator::get_total(&pLVar7->perf_,s);
                      if (pdVar4[uVar23] <= dVar25) {
                        dVar25 = pdVar4[uVar23];
                      }
                      min_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar23] = dVar25;
                    }
                    lVar16 = lVar16 + 0x20;
                  }
                  (*pLVar7->_vptr_Labeling[5])();
                }
                pbVar24 = header.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar12].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                pbVar1 = header.
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar16 = 9;
                for (lVar19 = 0; (long)pbVar24 - (long)pbVar1 >> 5 != lVar19; lVar19 = lVar19 + 1) {
                  pMVar3 = results.
                           super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar12].
                           super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  lVar20 = **(long **)(&pMVar3->super_Mat + lVar16 * 8) * (long)(int)uVar18 +
                           *(long *)((long)pMVar3 + lVar16 * 8 + -0x38);
                  *(double *)(lVar20 + (long)(int)uVar14 * 8) =
                       (double)(~-(ulong)(min_times.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start[lVar19] ==
                                         1.79769313486232e+308) &
                               (ulong)min_times.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar19]) +
                       *(double *)(lVar20 + (long)(int)uVar14 * 8);
                  lVar16 = lVar16 + 0xc;
                }
                std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                          (&min_times.super__Vector_base<double,_std::allocator<double>_>);
                uVar18 = uVar18 + 1;
              }
              std::__cxx11::string::~string((string *)&algo_name_1);
              uVar11 = uVar11 + 1;
            }
          }
          std::__cxx11::string::~string((string *)&filename_path);
          std::__cxx11::string::~string((string *)&filename);
          progress = progress + 1;
        }
        OutputBox::StopUnitaryBox(&ob);
      }
      else {
        std::__cxx11::string::string((string *)&algo_name_1,(string *)&is_path);
        std::operator+(&filename_path.path_,"Unable to open \'",&algo_name_1);
        std::operator+(&filename,&filename_path.path_,"\', skipped");
        OutputBox::Cwarning(&ob,&filename,(string *)&tmp);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&filename_path);
        std::__cxx11::string::~string((string *)&algo_name_1);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~vector(&filenames);
    }
    else {
      std::__cxx11::string::string((string *)&algo_name_1,(string *)&current_output_path);
      std::operator+(&filename_path.path_,"Unable to find/create the output path \'",&algo_name_1);
      std::operator+(&filename,&filename_path.path_,"\', skipped");
      OutputBox::Cwarning(&ob,&filename,(string *)&tmp);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&filename_path);
      std::__cxx11::string::~string((string *)&algo_name_1);
    }
    std::__cxx11::string::~string((string *)&current_latex_path);
    std::__cxx11::string::~string((string *)&is_path);
    std::__cxx11::string::~string((string *)&dataset_path);
    std::__cxx11::string::~string((string *)&tmp);
    uVar14 = uVar14 + 1;
    pMVar8 = this->mode_cfg_;
  }
  uVar12 = 0;
  while( true ) {
    pbVar24 = (pMVar8->ccl_blocksize_algorithms).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pMVar8->ccl_blocksize_algorithms).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar24 >> 5) <= uVar12)
    break;
    std::operator+(&filename,pbVar24 + uVar12,".csv");
    filesystem::path::path(&current_latex_path,&filename);
    filesystem::operator/(&is_path,&current_output_path,&current_latex_path);
    std::__cxx11::string::string((string *)&dataset_path,(string *)&is_path);
    std::ofstream::ofstream((ostream *)&tmp,(string *)&dataset_path,_S_out);
    std::__cxx11::string::~string((string *)&dataset_path);
    std::__cxx11::string::~string((string *)&is_path);
    std::__cxx11::string::~string((string *)&current_latex_path);
    std::__cxx11::string::~string((string *)&filename);
    std::operator<<((ostream *)&tmp,",,Kernel");
    pbVar1 = header.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar24 = header.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar1;
        pbVar24 = pbVar24 + 1) {
      for (uVar15 = 0;
          uVar15 < (ulong)((long)(this->mode_cfg_->blocksize_datasets).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->mode_cfg_->blocksize_datasets).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar15 = uVar15 + 1) {
        poVar9 = std::operator<<((ostream *)&tmp,',');
        std::operator<<(poVar9,(string *)pbVar24);
      }
    }
    std::operator<<((ostream *)&tmp,"\nX,Y,Z");
    for (uVar15 = 0;
        uVar15 < (ulong)((long)header.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)header.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar15 = uVar15 + 1)
    {
      pbVar1 = (this->mode_cfg_->blocksize_datasets).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar24 = (this->mode_cfg_->blocksize_datasets).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar24 != pbVar1;
          pbVar24 = pbVar24 + 1) {
        poVar9 = std::operator<<((ostream *)&tmp,',');
        std::operator<<(poVar9,(string *)pbVar24);
      }
    }
    std::operator<<((ostream *)&tmp,"\n");
    uVar15 = 0;
    while( true ) {
      if ((ulong)(((long)dims.
                         super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)dims.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar15) break;
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&tmp,
                          dims.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_elems[0]);
      poVar9 = std::operator<<(poVar9,',');
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (poVar9,dims.
                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_elems[1]);
      poVar9 = std::operator<<(poVar9,',');
      std::ostream::operator<<
                (poVar9,dims.
                        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_elems[2]);
      for (uVar23 = 0;
          uVar23 < (ulong)((long)header.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)header.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar23 = uVar23 + 1) {
        for (uVar22 = 0;
            uVar22 < (ulong)((long)(this->mode_cfg_->blocksize_datasets).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->mode_cfg_->blocksize_datasets).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar22 = uVar22 + 1) {
          std::operator<<((ostream *)&tmp,',');
          pMVar3 = results.
                   super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::ostream::_M_insert<double>
                    (*(double *)
                      (**(long **)&pMVar3[uVar23].field_0x48 * uVar15 +
                       *(long *)&pMVar3[uVar23].field_0x10 + uVar22 * 8));
        }
      }
      std::operator<<((ostream *)&tmp,'\n');
      uVar15 = uVar15 + 1;
    }
    std::ofstream::~ofstream((ostream *)&tmp);
    uVar12 = uVar12 + 1;
    pMVar8 = this->mode_cfg_;
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&header);
  std::
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ::~vector(&results);
  std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
            (&dims.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)
  ;
  std::__cxx11::string::~string((string *)&current_output_path);
  OutputBox::~OutputBox(&ob);
  return;
}

Assistant:

void YacclabTests::BlockSizeTest() {
    OutputBox ob(mode_cfg_.mode + " Block Size Test");

    path current_output_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / path("Blocksize"));

    // Create vector of dims (arrays of three int)
    int maxsize = 0;

#if defined YACCLAB_WITH_CUDA
    cudaDeviceProp prop;
    cudaGetDeviceProperties(&prop, 0);
    maxsize = prop.maxThreadsPerBlock;
#endif

    std::vector<std::array<int, 3>> dims;

    for (int x = mode_cfg_.blocksize_x[0]; x <= mode_cfg_.blocksize_x[1]; x += mode_cfg_.blocksize_x[2]) {
        for (int y = mode_cfg_.blocksize_y[0]; y <= mode_cfg_.blocksize_y[1]; y += mode_cfg_.blocksize_y[2]) {
            for (int z = mode_cfg_.blocksize_z[0]; z <= mode_cfg_.blocksize_z[1]; z += mode_cfg_.blocksize_z[2]) {
                if (x * y * z <= maxsize) {
                    dims.push_back({ x, y, z });
                }
            }
        }
    }

    std::vector<std::vector<cv::Mat1d>> results;					// One dims x datasets matrix for each kernel for each algorithm
    std::vector<std::vector<std::string>> header;					// Kernel names for each algorithm
    for (const auto& algo_name : mode_cfg_.ccl_blocksize_algorithms) {

        const auto& kernels = KernelMapSingleton::GetKernels(algo_name);
        header.push_back(kernels);

    }

    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {
        std::vector<cv::Mat1d> tmp;

        for (int k = 0; k < header[alg].size(); ++k) {
            tmp.emplace_back(static_cast<int>(dims.size()), static_cast<int>(mode_cfg_.average_datasets.size()), (double)0);
        }

        results.push_back(std::move(tmp));
    }

    for (unsigned d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) { // For every dataset in the average list

        std::string dataset_name(mode_cfg_.blocksize_datasets[d]);

        path dataset_path(glob_cfg_.input_path / path(dataset_name)),
            is_path = dataset_path / path(glob_cfg_.input_txt), // files.txt path
            current_latex_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / glob_cfg_.latex_path);

        if (!create_directories(current_output_path)) {
            ob.Cwarning("Unable to find/create the output path '" + current_output_path.string() + "', skipped", dataset_name);
            continue;
        }

        // To save list of filename on which CLLAlgorithms must be tested
        std::vector<std::pair<std::string, bool>> filenames;  // first: filename, second: state of filename (find or not)
        if (!LoadFileList(filenames, is_path)) {
            ob.Cwarning("Unable to open '" + is_path.string() + "', skipped", dataset_name);
            continue;
        }

        // Number of files
        unsigned filenames_size = static_cast<unsigned>(filenames.size());

        // Start output message box
        ob.StartUnitaryBox(dataset_name, filenames_size);

        for (unsigned file = 0; file < filenames.size(); ++file) {

            ob.UpdateUnitaryBox(file);

            std::string filename = filenames[file].first;
            path filename_path = dataset_path / path(filename);

            // Read and load image
            if (!LabelingMapSingleton::GetLabeling(mode_cfg_.ccl_blocksize_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
                ob.Cmessage("Unable to open '" + filename + "', skipped");
                continue;
            }

            for (unsigned alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

                std::string algo_name = mode_cfg_.ccl_blocksize_algorithms[alg];

                Labeling* algorithm = LabelingMapSingleton::GetLabeling(algo_name);

                for (unsigned dim = 0; dim < dims.size(); ++dim) {

                    std::vector<double> min_times(header[alg].size(), std::numeric_limits<double>::max());

                    for (unsigned it = 0; it < mode_cfg_.blocksize_tests_number; ++it) {

                        try {
                            // Perform current algorithm on current image and save result.
                            algorithm->perf_.reset_counters();
                            algorithm->PerformLabelingBlocksize(dims[dim][0], dims[dim][1], dims[dim][2]);
                        }
                        catch (const std::exception& e) {
                            algorithm->FreeLabelingData();
                            ob.Cerror("Something wrong with " + algo_name + ": " + e.what()); // You should check your algorithms' implementation before performing YACCLAB tests  
                        }

                        for (int k = 0; k < header[alg].size(); ++k) {
                            const auto& kernel = header[alg][k];

                            if (algorithm->perf_.find(kernel)) {
                                min_times[k] = std::min(min_times[k], algorithm->perf_.get_total(kernel));
                            }
                        }

                        algorithm->FreeLabelingData();
                    }

                    // For each image, execution times are summed, in order to find average
                    for (int k = 0; k < header[alg].size(); ++k) {
                        // If min time is DBL_MAX, the kernel was never run
                        results[alg][k](dim, d) += (min_times[k] == std::numeric_limits<double>::max() ? 0 : min_times[k]);
                    }

                }

            }

        } // END IMAGE FOR
        ob.StopUnitaryBox();

        // TODO: decide if values should be averaged (they are just summed for now)
        //for (auto& result_mat : results) {
        //	result_mat /= static_cast<double>(filenames.size());
        //}

    } // END DATASET FOR

    
    // Print results
    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

        {   // To automatically destroy ofstream os

            std::ofstream os((current_output_path / path(mode_cfg_.ccl_blocksize_algorithms[alg] + ".csv")).string());

            os << ",,Kernel";
            for (const auto& kernel : header[alg]) {
                for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                    os << ',' << kernel;
                }
            }
            os << "\nX,Y,Z";

            for (int k = 0; k < header[alg].size(); ++k) {
                for (const auto& dataset : mode_cfg_.blocksize_datasets) {
                    os << ',' << dataset;
                }
            }
            os << "\n";

            for (int dim = 0; dim < dims.size(); ++dim) {
                os << dims[dim][0] << ',' << dims[dim][1] << ',' << dims[dim][2];
                for (int k = 0; k < header[alg].size(); ++k) {
                    for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                        os << ',' << results[alg][k](dim, d);
                    }
                }
                os << '\n';
            }

        }
    }

}